

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_0,_false,_false>::operator()
          (gemm_pack_rhs<double,_long,_4,_0,_false,_false> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  bool bVar11;
  
  if (offset == 0 && stride == 0) {
    lVar1 = cols / 4;
    lVar6 = 0;
    if (depth < 1) {
      depth = lVar6;
    }
    lVar3 = lVar1 * 4;
    pdVar9 = rhs + rhsStride;
    pdVar10 = rhs + rhsStride * 2;
    pdVar8 = rhs + rhsStride * 3;
    lVar7 = 0;
    pdVar4 = rhs;
    for (; SBORROW8(lVar6,lVar3) != lVar6 + lVar1 * -4 < 0; lVar6 = lVar6 + 4) {
      lVar2 = 0;
      lVar5 = depth;
      while (bVar11 = lVar5 != 0, lVar5 = lVar5 + -1, bVar11) {
        blockB[lVar7 + lVar2] = *(double *)((long)pdVar4 + lVar2 * 2);
        blockB[lVar7 + lVar2 + 1] = *(double *)((long)pdVar9 + lVar2 * 2);
        blockB[lVar7 + lVar2 + 2] = *(double *)((long)pdVar10 + lVar2 * 2);
        blockB[lVar7 + lVar2 + 3] = *(double *)((long)pdVar8 + lVar2 * 2);
        lVar2 = lVar2 + 4;
      }
      pdVar4 = pdVar4 + rhsStride * 4;
      pdVar9 = pdVar9 + rhsStride * 4;
      pdVar10 = pdVar10 + rhsStride * 4;
      pdVar8 = pdVar8 + rhsStride * 4;
      lVar7 = lVar7 + lVar2;
    }
    pdVar4 = rhs + lVar1 * rhsStride * 4;
    for (; lVar3 < cols; lVar3 = lVar3 + 1) {
      for (lVar1 = 0; depth != lVar1; lVar1 = lVar1 + 1) {
        blockB[lVar7 + lVar1] = pdVar4[lVar1];
      }
      lVar7 = lVar7 + lVar1;
      pdVar4 = pdVar4 + rhsStride;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4c6,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 0>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    const Scalar* b1 = &rhs[(j2+1)*rhsStride];
    const Scalar* b2 = &rhs[(j2+2)*rhsStride];
    const Scalar* b3 = &rhs[(j2+3)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
                blockB[count+0] = cj(b0[k]);
                blockB[count+1] = cj(b1[k]);
      if(nr==4) blockB[count+2] = cj(b2[k]);
      if(nr==4) blockB[count+3] = cj(b3[k]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k]);
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}